

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_57051::DiskInterfaceTestStatExistingFile::~DiskInterfaceTestStatExistingFile
          (DiskInterfaceTestStatExistingFile *this)

{
  DiskInterfaceTestStatExistingFile *this_local;
  
  ~DiskInterfaceTestStatExistingFile(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, StatExistingFile) {
  string err;
  ASSERT_TRUE(Touch("file"));
  EXPECT_GT(disk_.Stat("file", &err), 1);
  EXPECT_EQ("", err);
}